

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_intersect(array_container_t *array1,array_container_t *array2)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  _Bool _Var6;
  ushort *puVar7;
  int iVar8;
  ushort *puVar9;
  array_container_t *paVar10;
  array_container_t *paVar11;
  ushort uVar12;
  int iVar13;
  
  iVar4 = array1->cardinality;
  iVar5 = array2->cardinality;
  paVar10 = array1;
  paVar11 = array2;
  iVar8 = iVar5;
  iVar13 = iVar4;
  if ((iVar5 <= iVar4 * 0x40) &&
     (paVar10 = array2, paVar11 = array1, iVar8 = iVar4, iVar13 = iVar5, iVar4 <= iVar5 * 0x40)) {
    if (iVar5 != 0 && iVar4 != 0) {
      puVar7 = array2->array;
      puVar9 = array1->array;
      puVar1 = puVar9 + iVar4;
      puVar2 = puVar7 + iVar5;
      uVar12 = *puVar7;
      do {
        uVar3 = *puVar9;
        if (uVar12 <= uVar3) {
          while( true ) {
            uVar12 = *puVar7;
            if (uVar3 <= uVar12) break;
            puVar7 = puVar7 + 1;
            if (puVar7 == puVar2) {
              return false;
            }
          }
          if (uVar3 == uVar12) {
            return true;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar1);
    }
    return false;
  }
  _Var6 = intersect_skewed_uint16_nonempty(paVar10->array,(long)iVar13,paVar11->array,(long)iVar8);
  return _Var6;
}

Assistant:

bool array_container_intersect(const array_container_t *array1,
                               const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_nonempty(array1->array, card_1,
                                                array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_nonempty(array2->array, card_2,
                                                array1->array, card_1);
    } else {
        // we do not bother vectorizing
        return intersect_uint16_nonempty(array1->array, card_1, array2->array,
                                         card_2);
    }
}